

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.c
# Opt level: O2

void split_rects(nhrect *r1,nhrect *r2)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  nhrect *pnVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  char cVar11;
  nhrect *r1_00;
  nhrect local_46;
  char local_42;
  char local_41;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  cVar11 = r1->lx;
  cVar1 = r1->ly;
  cVar2 = r1->hx;
  cVar3 = r1->hy;
  uVar8 = get_rect_ind(r1);
  uVar10 = (ulong)(uint)rect_cnt;
  if (-1 < (int)uVar8) {
    lVar9 = (long)rect_cnt;
    uVar10 = lVar9 - 1;
    rect_cnt = (int)uVar10;
    rect[uVar8] = *(nhrect *)(&DAT_0035572c + lVar9 * 4);
  }
  local_3c = (int)cVar11;
  local_40 = (int)cVar1;
  local_34 = (int)cVar2;
  local_38 = (int)cVar3;
  pnVar7 = rect + (uVar10 & 0xffffffff);
  local_42 = cVar1;
  local_41 = cVar11;
  while( true ) {
    cVar1 = local_42;
    r1_00 = pnVar7 + -1;
    if ((int)uVar10 < 1) break;
    cVar1 = r2->lx;
    local_46.hx = pnVar7[-1].hx;
    if (cVar1 <= local_46.hx) {
      cVar4 = r2->ly;
      local_46.hy = pnVar7[-1].hy;
      if (cVar4 <= local_46.hy) {
        cVar5 = r2->hx;
        local_46.lx = r1_00->lx;
        if (local_46.lx <= cVar5) {
          cVar6 = r2->hy;
          local_46.ly = pnVar7[-1].ly;
          if (local_46.ly <= cVar6) {
            if (local_46.lx < cVar1) {
              local_46.lx = cVar1;
            }
            if (local_46.ly < cVar4) {
              local_46.ly = cVar4;
            }
            if (cVar5 < local_46.hx) {
              local_46.hx = cVar5;
            }
            if (cVar6 < local_46.hy) {
              local_46.hy = cVar6;
            }
            cVar11 = local_41;
            if ((local_46.lx <= local_46.hx) && (local_46.ly <= local_46.hy)) {
              split_rects(r1_00,&local_46);
            }
          }
        }
      }
    }
    uVar10 = (ulong)((int)uVar10 - 1);
    pnVar7 = r1_00;
  }
  if (local_40 - r2->ly < (int)((uint)('\x13' < cVar3) * 2 | 0xfffffff5)) {
    local_46.ly = local_42;
    local_46.hy = r2->ly + -2;
    local_46.lx = cVar11;
    local_46.hx = cVar2;
    add_rect(&local_46);
  }
  if (local_3c - r2->lx < (int)((uint)('N' < cVar2) * 3 + -0xd)) {
    local_46.ly = cVar1;
    local_46.hx = r2->lx + -2;
    local_46.lx = cVar11;
    local_46.hy = cVar3;
    add_rect(&local_46);
  }
  if (r2->hy - local_38 < (int)((uint)(cVar1 < '\x01') * 2 | 0xfffffff5)) {
    local_46.ly = r2->hy + '\x02';
    local_46.lx = cVar11;
    local_46.hx = cVar2;
    local_46.hy = cVar3;
    add_rect(&local_46);
  }
  if (r2->hx - local_34 < (int)((uint)(cVar11 < '\x01') * 3 + -0xd)) {
    local_46.ly = cVar1;
    local_46.lx = r2->hx + '\x02';
    local_46.hx = cVar2;
    local_46.hy = cVar3;
    add_rect(&local_46);
  }
  return;
}

Assistant:

void split_rects(struct nhrect *r1, struct nhrect *r2)
{
	struct nhrect r, old_r;
	int i;

	old_r = *r1;
	remove_rect(r1);

	/* Walk down since rect_cnt & rect[] will change... */
	for (i=rect_cnt-1; i>=0; i--)
	    if (intersect(&rect[i], r2, &r))
		split_rects(&rect[i], &r);
	
	if (r2->ly - old_r.ly-1 > (old_r.hy < ROWNO - 1 ? 2*YLIM : YLIM+1)+4) {
		r = old_r;
		r.hy = r2->ly - 2;
		add_rect(&r);
	}
	if (r2->lx - old_r.lx-1 > (old_r.hx < COLNO - 1 ? 2*XLIM : XLIM+1)+4) {
		r = old_r;
		r.hx = r2->lx - 2;
		add_rect(&r);
	}
	if (old_r.hy - r2->hy-1 > (old_r.ly > 0 ? 2*YLIM : YLIM+1)+4) {
		r = old_r;
		r.ly = r2->hy + 2;
		add_rect(&r);
	}
	if (old_r.hx - r2->hx-1 > (old_r.lx > 0 ? 2*XLIM : XLIM+1)+4) {
		r = old_r;
		r.lx = r2->hx + 2;
		add_rect(&r);
	}
}